

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rastack.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::RAStackAllocator::calculateStackFrame(RAStackAllocator *this)

{
  byte bVar1;
  bool bVar2;
  long *plVar3;
  int iVar4;
  Error EVar5;
  ulong uVar6;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  char *msg;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long *plVar15;
  RAStackSlot *__tmp;
  long lVar16;
  long *plVar17;
  RAStackSlot *__tmp_1;
  long lVar18;
  RAStackSlot *__tmp_2;
  ulong uVar19;
  long *plVar20;
  uint uVar21;
  uint uVar22;
  RAStackGap gap;
  ulong local_448 [2];
  undefined8 local_438 [129];
  
  plVar7 = *(long **)(this + 0x18);
  uVar6 = (ulong)*(uint *)(this + 0x20);
  plVar9 = plVar7 + uVar6;
  for (lVar14 = 0; uVar6 * 8 - lVar14 != 0; lVar14 = lVar14 + 8) {
    lVar13 = *(long *)((long)plVar7 + lVar14);
    bVar1 = *(byte *)(lVar13 + 1);
    if (bVar1 == 0) {
      msg = "alignment > 0";
      iVar10 = 0x46;
LAB_0012571e:
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rastack.cpp"
                 ,iVar10,msg);
    }
    uVar22 = 0;
    if (bVar1 != 0) {
      for (; (bVar1 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
      }
    }
    uVar19 = 6;
    if ((char)uVar22 != '\a') {
      uVar19 = (ulong)uVar22;
    }
    if ((*(byte *)(lVar13 + 2) & 1) == 0) {
      uVar19 = uVar19 & 0xff;
    }
    else {
      uVar19 = (ulong)(byte)((byte)uVar19 ^ 7) * (ulong)*(uint *)(lVar13 + 8) + 0x10;
    }
    if (0xfffffffe < uVar19) {
      uVar19 = 0xffffffff;
    }
    *(int *)(lVar13 + 0xc) = (int)uVar19;
  }
  lVar14 = 0;
LAB_001253e9:
  while (uVar19 = (long)plVar9 - (long)plVar7 >> 3, uVar19 < 8) {
    if (plVar7 != plVar9) {
      plVar9 = plVar7;
LAB_0012543c:
      plVar9 = plVar9 + 1;
      plVar15 = plVar9;
      if (plVar9 < plVar7 + uVar19) {
        for (; plVar7 < plVar15; plVar15 = plVar15 + -1) {
          lVar13 = plVar15[-1];
          if (*(uint *)(lVar13 + 0xc) <= *(uint *)(*plVar15 + 0xc)) break;
          plVar15[-1] = *plVar15;
          *plVar15 = lVar13;
        }
        goto LAB_0012543c;
      }
    }
    if (lVar14 == 0) {
      local_438[10] = 0;
      local_438[0xb] = 0;
      local_438[8] = 0;
      local_438[9] = 0;
      local_438[6] = 0;
      local_438[7] = 0;
      local_438[4] = 0;
      local_438[5] = 0;
      local_438[2] = 0;
      local_438[3] = 0;
      local_438[0] = 0;
      local_438[1] = 0;
      plVar7 = *(long **)(this + 0x18);
      plVar9 = plVar7 + uVar6;
      uVar6 = 0;
      do {
        iVar10 = (int)uVar6;
        if (plVar7 == plVar9) {
          *(uint *)(this + 0xc) = -*(int *)(this + 0x10) & (iVar10 + *(int *)(this + 0x10)) - 1U;
          return 0;
        }
        lVar14 = *plVar7;
        if ((*(byte *)(lVar14 + 2) & 2) == 0) {
          bVar1 = *(byte *)(lVar14 + 1);
          uVar22 = *(uint *)(lVar14 + 4);
          bVar2 = false;
          iVar4 = 0;
          uVar12 = 0;
          if (uVar22 < 0x40) {
            uVar12 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar19 = (ulong)uVar12 - 1;
            lVar13 = (long)local_438 + (ulong)(uVar12 << 4);
            do {
              if (*(int *)(lVar13 + 8) != 0) {
                ZoneVector<asmjit::v1_14::RAStackGap>::pop
                          ((ZoneVector<asmjit::v1_14::RAStackGap> *)&gap);
                if (gap.offset % (uint)bVar1 == 0) {
                  *(uint32_t *)(lVar14 + 0x10) = gap.offset;
                  iVar4 = gap.size - uVar22;
                  uVar12 = gap.offset - uVar22;
                  bVar2 = true;
                  goto LAB_00125616;
                }
                msg = "Support::isAligned(gap.offset, slotAlignment)";
                iVar10 = 0x7f;
                goto LAB_0012571e;
              }
              uVar19 = uVar19 + 1;
              lVar13 = lVar13 + 0x10;
            } while (uVar19 < 5);
            bVar2 = false;
            iVar4 = 0;
            uVar12 = 0;
          }
LAB_00125616:
          local_448[1] = (ulong)bVar1;
          uVar22 = -(uint)bVar1 & (iVar10 + (uint)bVar1) - 1;
          iVar10 = uVar22 - iVar10;
          iVar11 = iVar10;
          if (iVar10 == 0 || bVar2) {
            iVar11 = iVar4;
          }
          local_448[0] = uVar6 & 0xffffffff;
          if (!bVar2) {
            local_448[0] = (ulong)uVar22;
          }
          if (iVar11 != 0) {
            if (iVar10 == 0 || bVar2) {
              uVar22 = uVar12;
            }
            uVar12 = iVar11 + uVar22;
            while (uVar22 < uVar12) {
              iVar10 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
                }
              }
              uVar21 = 1 << ((byte)iVar10 & 0x1f);
              if (uVar12 - uVar22 < uVar21) break;
              gap.offset = uVar22;
              gap.size = uVar21;
              EVar5 = ZoneVector<asmjit::v1_14::RAStackGap>::append
                                ((ZoneVector<asmjit::v1_14::RAStackGap> *)
                                 ((long)local_438 + (ulong)(uint)(iVar10 << 4)),
                                 *(ZoneAllocator **)this,&gap);
              uVar22 = uVar22 + uVar21;
              if (EVar5 != 0) {
                return EVar5;
              }
            }
          }
          uVar6 = local_448[0];
          if (!bVar2) {
            if ((int)((local_448[0] & 0xffffffff) % (local_448[1] & 0xffffffff)) != 0) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rastack.cpp"
                         ,0xa5,"Support::isAligned(offset, slotAlignment)");
            }
            *(int *)(lVar14 + 0x10) = (int)local_448[0];
            uVar6 = (ulong)(uint)((int)local_448[0] + *(int *)(lVar14 + 4));
          }
        }
        plVar7 = plVar7 + 1;
      } while( true );
    }
    plVar7 = *(long **)((long)local_448 + lVar14);
    lVar13 = lVar14 + 8;
    lVar14 = lVar14 + -0x10;
    plVar9 = *(long **)((long)local_448 + lVar13);
  }
  plVar15 = plVar9 + -1;
  lVar18 = *(long *)((long)plVar7 + (uVar19 & 0xfffffffffffffffe) * 4);
  *(long *)((long)plVar7 + (uVar19 & 0xfffffffffffffffe) * 4) = *plVar7;
  *plVar7 = lVar18;
  lVar13 = plVar7[1];
  lVar16 = plVar9[-1];
  uVar22 = *(uint *)(lVar13 + 0xc);
  uVar12 = *(uint *)(lVar16 + 0xc);
  if (uVar12 < uVar22) {
    plVar7[1] = lVar16;
    *plVar15 = lVar13;
    lVar18 = *plVar7;
    lVar16 = lVar13;
    uVar12 = uVar22;
  }
  uVar22 = *(uint *)(lVar18 + 0xc);
  if (uVar12 < uVar22) {
    *plVar7 = lVar16;
    *plVar15 = lVar18;
    lVar18 = *plVar7;
    uVar22 = *(uint *)(lVar18 + 0xc);
  }
  plVar17 = plVar7 + 1;
  lVar13 = *plVar17;
  if (uVar22 < *(uint *)(lVar13 + 0xc)) {
    plVar7[1] = lVar18;
    *plVar7 = lVar13;
  }
LAB_001254c2:
  if (plVar17 < plVar15) goto code_r0x001254c7;
  goto LAB_001254dc;
code_r0x001254c7:
  plVar8 = plVar17 + 1;
  plVar17 = plVar17 + 1;
  if (*(uint *)(*plVar8 + 0xc) < *(uint *)(*plVar7 + 0xc)) goto LAB_001254c2;
LAB_001254dc:
  do {
    if (plVar15 <= plVar7) break;
    plVar8 = plVar15 + -1;
    plVar15 = plVar15 + -1;
  } while (*(uint *)(*plVar7 + 0xc) < *(uint *)(*plVar8 + 0xc));
  if (plVar17 <= plVar15) {
    lVar13 = *plVar17;
    *plVar17 = *plVar15;
    *plVar15 = lVar13;
    goto LAB_001254c2;
  }
  lVar13 = *plVar7;
  *plVar7 = *plVar15;
  *plVar15 = lVar13;
  plVar8 = plVar7;
  plVar3 = plVar15;
  plVar20 = plVar9;
  if ((long)plVar9 - (long)plVar17 < (long)plVar15 - (long)plVar7) {
    plVar8 = plVar17;
    plVar3 = plVar9;
    plVar17 = plVar7;
    plVar20 = plVar15;
  }
  plVar9 = plVar3;
  *(long **)((long)local_438 + lVar14) = plVar17;
  *(long **)((long)local_438 + lVar14 + 8) = plVar20;
  if (0x3f0 < lVar14) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/../core/../core/../core/support.h"
               ,0x606,"stackptr <= stack + kStackSize");
  }
  lVar14 = lVar14 + 0x10;
  plVar7 = plVar8;
  goto LAB_001253e9;
}

Assistant:

Error RAStackAllocator::calculateStackFrame() noexcept {
  // Base weight added to all registers regardless of their size and alignment.
  uint32_t kBaseRegWeight = 16;

  // STEP 1:
  //
  // Update usage based on the size of the slot. We boost smaller slots in a way that 32-bit register has a higher
  // priority than a 128-bit register, however, if one 128-bit register is used 4 times more than some other 32-bit
  // register it will overweight it.
  for (RAStackSlot* slot : _slots) {
    uint32_t alignment = slot->alignment();
    ASMJIT_ASSERT(alignment > 0);

    uint32_t power = Support::min<uint32_t>(Support::ctz(alignment), 6);
    uint64_t weight;

    if (slot->isRegHome())
      weight = kBaseRegWeight + (uint64_t(slot->useCount()) * (7 - power));
    else
      weight = power;

    // If overflown, which has less chance of winning a lottery, just use max possible weight. In such case it
    // probably doesn't matter at all.
    if (weight > 0xFFFFFFFFu)
      weight = 0xFFFFFFFFu;

    slot->setWeight(uint32_t(weight));
  }

  // STEP 2:
  //
  // Sort stack slots based on their newly calculated weight (in descending order).
  _slots.sort([](const RAStackSlot* a, const RAStackSlot* b) noexcept {
    return a->weight() >  b->weight() ? 1 :
           a->weight() == b->weight() ? 0 : -1;
  });

  // STEP 3:
  //
  // Calculate offset of each slot. We start from the slot that has the highest weight and advance to slots with
  // lower weight. It could look that offsets start from the first slot in our list and then simply increase, but
  // it's not always the case as we also try to fill all gaps introduced by the fact that slots are sorted by
  // weight and not by size & alignment, so when we need to align some slot we distribute the gap caused by the
  // alignment to `gaps`.
  uint32_t offset = 0;
  ZoneVector<RAStackGap> gaps[kSizeCount - 1];

  for (RAStackSlot* slot : _slots) {
    if (slot->isStackArg())
      continue;

    uint32_t slotAlignment = slot->alignment();
    uint32_t alignedOffset = Support::alignUp(offset, slotAlignment);

    // Try to find a slot within gaps first, before advancing the `offset`.
    bool foundGap = false;
    uint32_t gapSize = 0;
    uint32_t gapOffset = 0;

    {
      uint32_t slotSize = slot->size();
      if (slotSize < (1u << uint32_t(ASMJIT_ARRAY_SIZE(gaps)))) {
        // Iterate from the lowest to the highest possible.
        uint32_t index = Support::ctz(slotSize);
        do {
          if (!gaps[index].empty()) {
            RAStackGap gap = gaps[index].pop();

            ASMJIT_ASSERT(Support::isAligned(gap.offset, slotAlignment));
            slot->setOffset(int32_t(gap.offset));

            gapSize = gap.size - slotSize;
            gapOffset = gap.offset - slotSize;

            foundGap = true;
            break;
          }
        } while (++index < uint32_t(ASMJIT_ARRAY_SIZE(gaps)));
      }
    }

    // No gap found, we may create a new one(s) if the current offset is not aligned.
    if (!foundGap && offset != alignedOffset) {
      gapSize = alignedOffset - offset;
      gapOffset = alignedOffset;

      offset = alignedOffset;
    }

    // True if we have found a gap and not filled all of it or we aligned the current offset.
    if (gapSize) {
      uint32_t gapEnd = gapSize + gapOffset;
      while (gapOffset < gapEnd) {
        uint32_t index = Support::ctz(gapOffset);
        uint32_t slotSize = 1u << index;

        // Weird case, better to bail...
        if (gapEnd - gapOffset < slotSize)
          break;

        ASMJIT_PROPAGATE(gaps[index].append(allocator(), RAStackGap(gapOffset, slotSize)));
        gapOffset += slotSize;
      }
    }

    if (!foundGap) {
      ASMJIT_ASSERT(Support::isAligned(offset, slotAlignment));
      slot->setOffset(int32_t(offset));
      offset += slot->size();
    }
  }

  _stackSize = Support::alignUp(offset, _alignment);
  return kErrorOk;
}